

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O0

TPM_RC TSS_Hash(TSS_DEVICE *tpm,BYTE *data,UINT32 dataSize,TPMI_ALG_HASH hashAlg,
               TPM2B_DIGEST *outHash)

{
  undefined1 local_432 [8];
  TPM2B_MAX_BUFFER dataBuf;
  TPM2B_DIGEST *outHash_local;
  TPMI_ALG_HASH hashAlg_local;
  BYTE *pBStack_20;
  UINT32 dataSize_local;
  BYTE *data_local;
  TSS_DEVICE *tpm_local;
  
  local_432._0_2_ = (undefined2)dataSize;
  if (dataSize < 0x401) {
    dataBuf._1018_8_ = outHash;
    outHash_local._2_2_ = hashAlg;
    outHash_local._4_4_ = dataSize;
    pBStack_20 = data;
    data_local = (BYTE *)tpm;
    MemoryCopy(local_432 + 2,data,dataSize);
    tpm_local._4_4_ =
         TPM2_Hash((TSS_DEVICE *)data_local,(TPM2B_MAX_BUFFER *)local_432,outHash_local._2_2_,
                   0x40000007,(TPM2B_DIGEST *)dataBuf._1018_8_,(TPMT_TK_HASHCHECK *)0x0);
  }
  else {
    tpm_local._4_4_ = 0x95;
  }
  return tpm_local._4_4_;
}

Assistant:

TPM_RC
TSS_Hash(
    TSS_DEVICE             *tpm,                // IN/OUT
    BYTE                   *data,               // IN
    UINT32                  dataSize,           // IN
    TPMI_ALG_HASH           hashAlg,            // IN
    TPM2B_DIGEST           *outHash             // OUT
)
{
    TPM2B_MAX_BUFFER    dataBuf;// = { (UINT16)dataSize };
    dataBuf.t.size = (UINT16)dataSize;

    if (dataSize > MAX_DIGEST_BUFFER)
        return TPM_RC_SIZE;
    MemoryCopy(dataBuf.t.buffer, data, dataSize);

    return TPM2_Hash(tpm, &dataBuf, hashAlg, TPM_RH_NULL, outHash, NULL);
}